

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_security_factory.c
# Opt level: O1

int iothub_security_init(IOTHUB_SECURITY_TYPE sec_type)

{
  ulong uVar1;
  bool bVar2;
  SECURE_DEVICE_TYPE SVar3;
  int iVar4;
  LOGGER_LOG p_Var5;
  ulong uVar6;
  
  uVar1 = (ulong)sec_type;
  bVar2 = false;
  if ((IOTHUB_SECURITY_TYPE_SYMMETRIC_KEY < sec_type) ||
     (uVar6 = uVar1, (0x16U >> (sec_type & 0x1f) & 1) == 0)) {
    bVar2 = true;
    uVar6 = 0;
  }
  if (bVar2) {
    p_Var5 = xlogging_get_log_function();
    iVar4 = 0x3f;
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                ,"iothub_security_init",0x3e,1,"Security type %d is not supported in this SDK build"
                ,uVar1);
    }
  }
  else {
    g_security_type = sec_type;
    SVar3 = prov_dev_security_get_type();
    if (SVar3 == SECURE_DEVICE_TYPE_UNKNOWN) {
      iVar4 = prov_dev_security_init((SECURE_DEVICE_TYPE)uVar6);
    }
    else {
      iVar4 = 0;
      if ((SECURE_DEVICE_TYPE)uVar6 != SVar3) {
        p_Var5 = xlogging_get_log_function();
        iVar4 = 0x4c;
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                    ,"iothub_security_init",0x4b,1,
                    "Security type from caller %d (which maps to security device type %d) does not match already specified security device type %d"
                    ,uVar1,uVar6,(ulong)SVar3);
        }
      }
    }
    if (iVar4 == 0) {
      iVar4 = initialize_hsm_system();
      return iVar4;
    }
  }
  return iVar4;
}

Assistant:

int iothub_security_init(IOTHUB_SECURITY_TYPE sec_type)
{
    int result;

    SECURE_DEVICE_TYPE secure_device_type_from_caller = get_secure_device_type(sec_type);

    if (secure_device_type_from_caller == SECURE_DEVICE_TYPE_UNKNOWN)
    {
        LogError("Security type %d is not supported in this SDK build", sec_type);
        result = MU_FAILURE;
    }
    else
    {
        g_security_type = sec_type;
        SECURE_DEVICE_TYPE security_device_type_from_prov = prov_dev_security_get_type();
        if (security_device_type_from_prov == SECURE_DEVICE_TYPE_UNKNOWN)
        {
            result = prov_dev_security_init(secure_device_type_from_caller);
        }
        else if (secure_device_type_from_caller != security_device_type_from_prov)
        {
            LogError("Security type from caller %d (which maps to security device type %d) does not match already specified security device type %d", sec_type, secure_device_type_from_caller, security_device_type_from_prov);
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }

        if (result == 0)
        {
            result = initialize_hsm_system();
        }
    }
    return result;
}